

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void upb_inttable_compact(upb_inttable *t,upb_Arena *a)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double local_1f0;
  uintptr_t local_1e0;
  upb_value local_1d8;
  upb_value val_1;
  uintptr_t key_1;
  intptr_t iter_1;
  ulong uStack_1b8;
  int hashsize_lg2;
  size_t hash_size;
  size_t hash_count;
  size_t arr_size;
  upb_inttable new_t;
  ulong uStack_160;
  int size_lg2;
  size_t arr_count;
  int bucket;
  upb_value val;
  uintptr_t key;
  intptr_t iter;
  uintptr_t max [17];
  long local_a8;
  size_t counts [17];
  upb_Arena *a_local;
  upb_inttable *t_local;
  
  memset(&local_a8,0,0x88);
  memset(&iter,0,0x88);
  key = 0xffffffffffffffff;
  while (_Var1 = upb_inttable_next(t,&val.val,(upb_value *)&stack0xfffffffffffffeb0,(intptr_t *)&key
                                  ), _Var1) {
    iVar2 = log2ceil(val.val);
    if (val.val < max[(long)iVar2 + -1]) {
      local_1e0 = max[(long)iVar2 + -1];
    }
    else {
      local_1e0 = val.val;
    }
    max[(long)iVar2 + -1] = local_1e0;
    counts[(long)iVar2 + -1] = counts[(long)iVar2 + -1] + 1;
  }
  uStack_160 = upb_inttable_count(t);
  for (new_t.array_count._4_4_ = 0x10; 0 < new_t.array_count._4_4_;
      new_t.array_count._4_4_ = new_t.array_count._4_4_ + -1) {
    if (counts[(long)new_t.array_count._4_4_ + -1] != 0) {
      auVar4._8_4_ = (int)(uStack_160 >> 0x20);
      auVar4._0_8_ = uStack_160;
      auVar4._12_4_ = 0x45300000;
      if ((double)(1 << ((byte)new_t.array_count._4_4_ & 0x1f)) * 0.1 <=
          (auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uStack_160) - 4503599627370496.0)) break;
      uStack_160 = uStack_160 - counts[(long)new_t.array_count._4_4_ + -1];
    }
  }
  sVar3 = upb_inttable_count(t);
  if (sVar3 < uStack_160) {
    __assert_fail("arr_count <= upb_inttable_count(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/hash/common.c"
                  ,0x2c6,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  hash_count = max[(long)new_t.array_count._4_4_ + -1] + 1;
  sVar3 = upb_inttable_count(t);
  hash_size = sVar3 - uStack_160;
  if (hash_size == 0) {
    local_1f0 = 0.0;
  }
  else {
    auVar5._8_4_ = (int)(hash_size >> 0x20);
    auVar5._0_8_ = hash_size;
    auVar5._12_4_ = 0x45300000;
    local_1f0 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)hash_size) - 4503599627370496.0)) / 0.85 + 1.0;
  }
  uStack_1b8 = (long)local_1f0 | (long)(local_1f0 - 9.223372036854776e+18) & (long)local_1f0 >> 0x3f
  ;
  iter_1._4_4_ = log2ceil(uStack_1b8);
  upb_inttable_sizedinit((upb_inttable *)&arr_size,hash_count,iter_1._4_4_,a);
  key_1 = 0xffffffffffffffff;
  while (_Var1 = upb_inttable_next(t,&val_1.val,&local_1d8,(intptr_t *)&key_1), _Var1) {
    upb_inttable_insert((upb_inttable *)&arr_size,val_1.val,local_1d8,a);
  }
  if (new_t.array != (upb_tabval *)hash_count) {
    __assert_fail("new_t.array_size == arr_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/hash/common.c"
                  ,0x2da,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  if ((byte)new_t.t.mask != iter_1._4_4_) {
    __assert_fail("new_t.t.size_lg2 == hashsize_lg2",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/hash/common.c"
                  ,0x2db,"void upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  memcpy(t,&arr_size,0x38);
  return;
}

Assistant:

void upb_inttable_compact(upb_inttable* t, upb_Arena* a) {
  /* A power-of-two histogram of the table keys. */
  size_t counts[UPB_MAXARRSIZE + 1] = {0};

  /* The max key in each bucket. */
  uintptr_t max[UPB_MAXARRSIZE + 1] = {0};

  {
    intptr_t iter = UPB_INTTABLE_BEGIN;
    uintptr_t key;
    upb_value val;
    while (upb_inttable_next(t, &key, &val, &iter)) {
      int bucket = log2ceil(key);
      max[bucket] = UPB_MAX(max[bucket], key);
      counts[bucket]++;
    }
  }

  /* Find the largest power of two that satisfies the MIN_DENSITY
   * definition (while actually having some keys). */
  size_t arr_count = upb_inttable_count(t);
  int size_lg2;
  upb_inttable new_t;

  for (size_lg2 = ARRAY_SIZE(counts) - 1; size_lg2 > 0; size_lg2--) {
    if (counts[size_lg2] == 0) {
      /* We can halve again without losing any entries. */
      continue;
    } else if (arr_count >= (1 << size_lg2) * MIN_DENSITY) {
      break;
    }

    arr_count -= counts[size_lg2];
  }

  UPB_ASSERT(arr_count <= upb_inttable_count(t));

  {
    /* Insert all elements into new, perfectly-sized table. */
    size_t arr_size = max[size_lg2] + 1; /* +1 so arr[max] will fit. */
    size_t hash_count = upb_inttable_count(t) - arr_count;
    size_t hash_size = hash_count ? (hash_count / MAX_LOAD) + 1 : 0;
    int hashsize_lg2 = log2ceil(hash_size);

    upb_inttable_sizedinit(&new_t, arr_size, hashsize_lg2, a);

    {
      intptr_t iter = UPB_INTTABLE_BEGIN;
      uintptr_t key;
      upb_value val;
      while (upb_inttable_next(t, &key, &val, &iter)) {
        upb_inttable_insert(&new_t, key, val, a);
      }
    }

    UPB_ASSERT(new_t.array_size == arr_size);
    UPB_ASSERT(new_t.t.size_lg2 == hashsize_lg2);
  }
  *t = new_t;
}